

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_WriteLogicalCountExpr_Test::~ExprWriterTest_WriteLogicalCountExpr_Test
          (ExprWriterTest_WriteLogicalCountExpr_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteLogicalCountExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1), value = MakeConst(42);
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1, l0
  };
  auto count = MakeCount(args);
  CHECK_WRITE("if atleast 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::ATLEAST, value, count), n1, n0));
  CHECK_WRITE("if atmost 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::ATMOST, value, count), n1, n0));
  CHECK_WRITE("if exactly 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::EXACTLY, value, count), n1, n0));
  CHECK_WRITE("if !atleast 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_ATLEAST, value, count), n1, n0));
  CHECK_WRITE("if !atmost 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_ATMOST, value, count), n1, n0));
  CHECK_WRITE("if !exactly 42 (x1 = 0, 1, 0) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_EXACTLY, value, count), n1, n0));
}